

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  size_type sVar4;
  bool bVar5;
  char *__s;
  char *pcVar6;
  unsigned_long uVar7;
  long lVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  cmSourceFile *this_00;
  unsigned_long dindex;
  Directory dir;
  string sourceListValue;
  string file;
  string templateDirectory;
  string tdir;
  string fullname;
  string ext;
  string base;
  Directory local_148;
  string local_140;
  string local_120;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  char *local_d8;
  char *local_d0;
  char local_c8;
  undefined7 uStack_c7;
  string local_b8;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  local_e0 = args;
  if (local_58 == 0x40) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_100 = local_f0;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar2,pcVar2 + pbVar1->_M_string_length);
    local_d8 = &local_c8;
    local_d0 = (char *)0x0;
    local_c8 = '\0';
    bVar5 = cmsys::SystemTools::FileIsFullPath((char *)local_100);
    if (bVar5) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    else {
      __s = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      pcVar6 = local_d0;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,pcVar6,(ulong)__s);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_100);
    }
    pcVar6 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (local_e0->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    sVar4 = local_140._M_string_length;
    if (pcVar6 != (char *)0x0) {
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_140,0,(char *)sVar4,(ulong)pcVar6);
    }
    cmsys::Directory::Directory(&local_148);
    std::__cxx11::string::string((string *)&local_120,local_d8,(allocator *)local_98);
    bVar5 = cmsys::Directory::Load(&local_148,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((bVar5) && (uVar7 = cmsys::Directory::GetNumberOfFiles(&local_148), uVar7 != 0)) {
      dindex = 0;
      do {
        pcVar6 = cmsys::Directory::GetFile(&local_148,dindex);
        std::__cxx11::string::string((string *)&local_120,pcVar6,(allocator *)local_98);
        lVar8 = std::__cxx11::string::rfind((char *)&local_120,0x4b12af,0xffffffffffffffff);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)local_98,(ulong)&local_120);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_120);
          if ((local_48 != 0) &&
             (pcVar3 = (this->super_cmCommand).Makefile,
             _Var9 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               ((pcVar3->SourceFileExtensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (pcVar3->SourceFileExtensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,local_98),
             _Var9._M_current !=
             (((this->super_cmCommand).Makefile)->SourceFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_100,(long)local_100 + local_f8);
            std::__cxx11::string::append((char *)&local_b8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_120._M_dataplus._M_p);
            this_00 = cmMakefile::GetOrCreateSource
                                ((this->super_cmCommand).Makefile,&local_b8,false);
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ABSTRACT","");
            cmSourceFile::SetProperty(this_00,&local_78,"0");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((char *)local_140._M_string_length != (char *)0x0) {
              std::__cxx11::string::append((char *)&local_140);
            }
            std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_b8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        dindex = dindex + 1;
      } while (uVar7 != dindex);
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (local_e0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,local_140._M_dataplus._M_p);
    cmsys::Directory::~Directory(&local_148);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_002c256d;
  }
  else {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_002c256d;
  }
  operator_delete(local_140._M_dataplus._M_p,
                  CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                           local_140.field_2._M_local_buf[0]) + 1);
LAB_002c256d:
  return local_58 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string sourceListValue;
  std::string templateDirectory = args[0];
  std::string tdir;
  if(!cmSystemTools::FileIsFullPath(templateDirectory.c_str()))
    {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
    }
  else
    {
    tdir = templateDirectory;
    }

  // was the list already populated
  const char *def = this->Makefile->GetDefinition(args[1]);
  if (def)
    {
    sourceListValue = def;
    }

  // Load all the files in the directory
  cmsys::Directory dir;
  if(dir.Load(tdir.c_str()))
    {
    size_t numfiles = dir.GetNumberOfFiles();
    for(size_t i =0; i < numfiles; ++i)
      {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind(".");
      if( dotpos != std::string::npos )
        {
        std::string ext = file.substr(dotpos+1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        if(!base.empty()
            && std::find( this->Makefile->GetSourceExtensions().begin(),
                          this->Makefile->GetSourceExtensions().end(), ext )
                 != this->Makefile->GetSourceExtensions().end() )
          {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf =
            this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT","0");
          if(!sourceListValue.empty())
            {
            sourceListValue += ";";
            }
          sourceListValue += fullname;
          }
        }
      }
    }
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}